

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

char  [7] kj::_::operator*(String *param_1,long param_2,undefined8 param_3,undefined8 param_4,
                          StringPtr *param_5)

{
  Array<char> local_40;
  StringPtr local_28;
  
  operator*<unsigned_int_&>(&local_40);
  local_28.content.ptr = "(can\'t stringify)";
  local_28.content.size_ = 0x12;
  concat<kj::String,kj::StringPtr&,kj::StringPtr>
            (param_1,(_ *)&local_40,(String *)(param_2 + 0x10),&local_28,param_5);
  Array<char>::~Array(&local_40);
  return SUB87(param_1,0);
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}